

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_statements.cpp
# Opt level: O2

ConcurrentAssertionStatementSyntax * __thiscall
slang::parsing::Parser::parseConcurrentAssertion
          (Parser *this,NamedLabelSyntax *label,AttrList attributes)

{
  bool bVar1;
  TokenKind TVar2;
  PropertySpecSyntax *propertySpec;
  ActionBlockSyntax *action;
  ConcurrentAssertionStatementSyntax *pCVar3;
  logic_error *this_00;
  size_type sVar4;
  pointer ppAVar5;
  Token TVar6;
  Token closeParen;
  Token keyword;
  allocator<char> local_161;
  Token local_160;
  SyntaxKind local_14c;
  pointer local_148;
  size_type local_140;
  Info *local_138;
  undefined8 local_130;
  NamedLabelSyntax *local_128;
  Token local_120;
  Token local_110;
  string local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> local_60;
  
  sVar4 = attributes.size_;
  ppAVar5 = attributes.data_;
  Token::Token(&local_160);
  TVar6 = ParserBase::consume(&this->super_ParserBase);
  local_138 = TVar6.info;
  local_130 = TVar6._0_8_;
  TVar2 = TVar6.kind;
  local_148 = ppAVar5;
  local_140 = sVar4;
  local_128 = label;
  if (TVar2 == RestrictKeyword) {
    local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
    TVar6.info = local_138;
    TVar6.kind = (undefined2)local_130;
    TVar6._2_1_ = local_130._2_1_;
    TVar6.numFlags.raw = local_130._3_1_;
    TVar6.rawLen = local_130._4_4_;
    local_14c = RestrictPropertyStatement;
  }
  else {
    if (TVar2 == AssumeKeyword) {
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_14c = AssumePropertyStatement;
    }
    else if (TVar2 == CoverKeyword) {
      bVar1 = ParserBase::peek(&this->super_ParserBase,SequenceKeyword);
      if (bVar1) {
        local_160 = ParserBase::consume(&this->super_ParserBase);
        local_14c = CoverSequenceStatement;
      }
      else {
        local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
        local_14c = CoverPropertyStatement;
      }
    }
    else {
      local_14c = ExpectPropertyStatement;
      if (TVar2 == ExpectKeyword) goto LAB_002c7343;
      if (TVar2 != AssertKeyword) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/parsing/Parser_statements.cpp"
                   ,&local_161);
        std::operator+(&local_c0,&local_e0,":");
        std::__cxx11::to_string(&local_100,0x240);
        std::operator+(&local_a0,&local_c0,&local_100);
        std::operator+(&local_80,&local_a0,": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_60,&local_80,"Default case should be unreachable!");
        std::logic_error::logic_error(this_00,(string *)&local_60);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      local_160 = ParserBase::expect(&this->super_ParserBase,PropertyKeyword);
      local_14c = AssertPropertyStatement;
    }
    TVar6.info = local_138;
    TVar6.kind = (undefined2)local_130;
    TVar6._2_1_ = local_130._2_1_;
    TVar6.numFlags.raw = local_130._3_1_;
    TVar6.rawLen = local_130._4_4_;
  }
LAB_002c7343:
  local_138 = TVar6.info;
  local_130 = TVar6._0_8_;
  TVar6 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  propertySpec = parsePropertySpec(this);
  closeParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  action = parseActionBlock(this);
  local_60.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
  local_60.super_SyntaxListBase.super_SyntaxNode.kind = SyntaxList;
  local_60.super_SyntaxListBase.childCount = local_140;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
       local_148;
  local_60.super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ =
       local_140;
  local_60.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_004703a8;
  keyword.info = local_138;
  keyword.kind = (undefined2)local_130;
  keyword._2_1_ = local_130._2_1_;
  keyword.numFlags.raw = local_130._3_1_;
  keyword.rawLen = local_130._4_4_;
  local_120 = closeParen;
  local_110 = TVar6;
  pCVar3 = slang::syntax::SyntaxFactory::concurrentAssertionStatement
                     (&this->factory,local_14c,local_128,&local_60,keyword,local_160,TVar6,
                      propertySpec,closeParen,action);
  return pCVar3;
}

Assistant:

ConcurrentAssertionStatementSyntax& Parser::parseConcurrentAssertion(NamedLabelSyntax* label,
                                                                     AttrList attributes) {

    SyntaxKind kind = SyntaxKind::Unknown;
    Token propertyOrSequence;
    auto keyword = consume();

    switch (keyword.kind) {
        case TokenKind::AssertKeyword:
            kind = SyntaxKind::AssertPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::AssumeKeyword:
            kind = SyntaxKind::AssumePropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::CoverKeyword:
            if (peek(TokenKind::SequenceKeyword)) {
                kind = SyntaxKind::CoverSequenceStatement;
                propertyOrSequence = consume();
            }
            else {
                kind = SyntaxKind::CoverPropertyStatement;
                propertyOrSequence = expect(TokenKind::PropertyKeyword);
            }
            break;
        case TokenKind::RestrictKeyword:
            kind = SyntaxKind::RestrictPropertyStatement;
            propertyOrSequence = expect(TokenKind::PropertyKeyword);
            break;
        case TokenKind::ExpectKeyword:
            kind = SyntaxKind::ExpectPropertyStatement;
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto& spec = parsePropertySpec();
    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& action = parseActionBlock();

    return factory.concurrentAssertionStatement(kind, label, attributes, keyword,
                                                propertyOrSequence, openParen, spec, closeParen,
                                                action);
}